

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O0

void __thiscall
PSVIWriterHandlers::processDOMAttributes(PSVIWriterHandlers *this,DOMNamedNodeMap *attrs)

{
  DOMNamedNodeMap *pDVar1;
  bool bVar2;
  byte bVar3;
  DOMAttr *pDVar4;
  long *plVar5;
  XMLCh *pXVar6;
  XMLSize_t XVar7;
  DOMAttr *pDVar8;
  unsigned_long *puVar9;
  DOMAttr *attr_1;
  XMLSize_t NScount;
  DOMAttr *attr;
  XMLSize_t count;
  DOMNamedNodeMap *pDStack_18;
  bool firstFlag;
  DOMNamedNodeMap *attrs_local;
  PSVIWriterHandlers *this_local;
  
  pDStack_18 = attrs;
  attrs_local = (DOMNamedNodeMap *)this;
  xercesc_4_0::ValueVectorOf<unsigned_long>::removeAllElements(this->fNSAttributes);
  count._7_1_ = 1;
  attr = (DOMAttr *)0x0;
  while( true ) {
    pDVar8 = attr;
    pDVar4 = (DOMAttr *)(**(code **)(*(long *)pDStack_18 + 0x28))();
    if (pDVar4 <= pDVar8) break;
    plVar5 = (long *)(**(code **)(*(long *)pDStack_18 + 0x18))(pDStack_18,attr);
    pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0xb0))();
    bVar2 = xercesc_4_0::XMLString::equals(pXVar6,(XMLCh *)&xercesc_4_0::XMLUni::fgXMLNSURIName);
    if (bVar2) {
      xercesc_4_0::ValueVectorOf<unsigned_long>::addElement
                (this->fNSAttributes,(unsigned_long *)&attr);
    }
    else {
      if ((count._7_1_ & 1) != 0) {
        sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributes);
        count._7_1_ = 0;
      }
      sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttribute);
      pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0xb0))();
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNamespaceName,pXVar6);
      pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0xc0))();
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgLocalName,pXVar6);
      pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0xb8))();
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgPrefix,pXVar6);
      pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0x150))();
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNormalizedValue,pXVar6);
      bVar3 = (**(code **)(*plVar5 + 0x148))();
      pXVar6 = translateBool(this,(bool)(bVar3 & 1));
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSpecified,pXVar6);
      plVar5 = (long *)(**(code **)(*plVar5 + 0x170))();
      pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0x10))();
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributeType,pXVar6);
      sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgReferences);
      sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttribute);
    }
    attr = attr + 1;
  }
  if ((count._7_1_ & 1) == 0) {
    sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributes);
  }
  else {
    writeEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributes);
  }
  XVar7 = xercesc_4_0::ValueVectorOf<unsigned_long>::size(this->fNSAttributes);
  if (XVar7 == 0) {
    writeEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNamespaceAttributes);
  }
  else {
    sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNamespaceAttributes);
    attr_1 = (DOMAttr *)0x0;
    while( true ) {
      pDVar8 = (DOMAttr *)xercesc_4_0::ValueVectorOf<unsigned_long>::size(this->fNSAttributes);
      pDVar1 = pDStack_18;
      if (pDVar8 <= attr_1) break;
      puVar9 = xercesc_4_0::ValueVectorOf<unsigned_long>::elementAt
                         (this->fNSAttributes,(XMLSize_t)attr_1);
      plVar5 = (long *)(**(code **)(*(long *)pDVar1 + 0x18))(pDVar1,*puVar9);
      sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttribute);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNamespaceName,
                       (XMLCh *)&xercesc_4_0::XMLUni::fgXMLNSURIName);
      pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0xc0))();
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgLocalName,pXVar6);
      pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0xb8))();
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgPrefix,pXVar6);
      pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0x150))();
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNormalizedValue,pXVar6);
      bVar3 = (**(code **)(*plVar5 + 0x148))();
      pXVar6 = translateBool(this,(bool)(bVar3 & 1));
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSpecified,pXVar6);
      plVar5 = (long *)(**(code **)(*plVar5 + 0x170))();
      pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0x10))();
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributeType,pXVar6);
      sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgReferences);
      sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttribute);
      attr_1 = attr_1 + 1;
    }
    sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNamespaceAttributes);
  }
  return;
}

Assistant:

void PSVIWriterHandlers::processDOMAttributes(DOMNamedNodeMap* attrs) {
	fNSAttributes->removeAllElements();
	bool firstFlag = true;
	for (XMLSize_t count=0; count < attrs->getLength(); count++) {
		DOMAttr* attr = (DOMAttr*)attrs->item(count);
        if (XMLString::equals(attr->getNamespaceURI(), XMLUni::fgXMLNSURIName)) {
			fNSAttributes->addElement(count);
		} else {
			if (firstFlag) {
				sendIndentedElement(PSVIUni::fgAttributes);
				firstFlag = false;
			}
			sendIndentedElement(PSVIUni::fgAttribute);
			sendElementValue(PSVIUni::fgNamespaceName, attr->getNamespaceURI());
			sendElementValue(PSVIUni::fgLocalName, attr->getLocalName());
			sendElementValue(PSVIUni::fgPrefix, attr->getPrefix());
			sendElementValue(PSVIUni::fgNormalizedValue, attr->getValue());
			sendElementValue(PSVIUni::fgSpecified, translateBool(attr->getSpecified()));
			sendElementValue(PSVIUni::fgAttributeType, attr->getSchemaTypeInfo()->getTypeName());
			sendElementEmpty(PSVIUni::fgReferences);
			sendUnindentedElement(PSVIUni::fgAttribute);
		}
	}
	if (firstFlag)
		writeEmpty(PSVIUni::fgAttributes);
	else
		sendUnindentedElement(PSVIUni::fgAttributes);

	//now for namespace attributes
	if (fNSAttributes->size()==0) {
		writeEmpty(PSVIUni::fgNamespaceAttributes);
	} else {
		sendIndentedElement(PSVIUni::fgNamespaceAttributes);
		for (XMLSize_t NScount = 0; NScount < fNSAttributes->size(); NScount++) {
			DOMAttr* attr = (DOMAttr*)attrs->item(fNSAttributes->elementAt(NScount));
			sendIndentedElement(PSVIUni::fgAttribute);
			sendElementValue(PSVIUni::fgNamespaceName, XMLUni::fgXMLNSURIName);
			sendElementValue(PSVIUni::fgLocalName, attr->getLocalName());
			sendElementValue(PSVIUni::fgPrefix, attr->getPrefix());
			sendElementValue(PSVIUni::fgNormalizedValue, attr->getValue());
			sendElementValue(PSVIUni::fgSpecified, translateBool(attr->getSpecified()));
			sendElementValue(PSVIUni::fgAttributeType, attr->getSchemaTypeInfo()->getTypeName());
			sendElementEmpty(PSVIUni::fgReferences);
			sendUnindentedElement(PSVIUni::fgAttribute);
		}
		sendUnindentedElement(PSVIUni::fgNamespaceAttributes);
	}
}